

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<wchar_t>::parse(NFA<wchar_t> *this,Stream *stream)

{
  wchar_t ch;
  NFA<wchar_t> nfa;
  NFA<wchar_t> local_50;
  
  ch = Stream::get(stream);
  while ((0x2f < (uint)ch || ((0x820000000001U >> ((ulong)(uint)ch & 0x3f) & 1) == 0))) {
    NFA(&local_50);
    parse_selection(&local_50,stream,ch);
    concat(this,&local_50);
    local_50.super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>._vptr_NFABase =
         (_func_int **)&PTR__NFABase_00186d20;
    std::
    vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
    ::~vector(&local_50.super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states);
    ch = Stream::get(stream);
  }
  return;
}

Assistant:

void parse(Stream& stream)
    {
        for (wchar_t ch = stream.get(); ch != L')' && ch != L'/' && ch != L'\0'; ch = stream.get())
        {
            NFA<TCHAR> nfa;
            nfa.parse_selection(stream, ch);
            concat(nfa);
        }
    }